

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVm(ExpressionContext *ctx,VmModule *module,ExprBase *expression)

{
  ExprBase *expression_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  switch(expression->typeID) {
  case 2:
    ctx_local = (ExpressionContext *)CompileVmVoid(ctx,module,(ExprVoid *)expression);
    break;
  case 3:
    ctx_local = (ExpressionContext *)CompileVmBoolLiteral(ctx,module,(ExprBoolLiteral *)expression);
    break;
  case 4:
    ctx_local = (ExpressionContext *)
                CompileVmCharacterLiteral(ctx,module,(ExprCharacterLiteral *)expression);
    break;
  case 5:
    ctx_local = (ExpressionContext *)
                CompileVmStringLiteral(ctx,module,(ExprStringLiteral *)expression);
    break;
  case 6:
    ctx_local = (ExpressionContext *)
                CompileVmIntegerLiteral(ctx,module,(ExprIntegerLiteral *)expression);
    break;
  case 7:
    ctx_local = (ExpressionContext *)
                CompileVmRationalLiteral(ctx,module,(ExprRationalLiteral *)expression);
    break;
  case 8:
    ctx_local = (ExpressionContext *)CompileVmTypeLiteral(ctx,module,(ExprTypeLiteral *)expression);
    break;
  case 9:
    ctx_local = (ExpressionContext *)
                CompileVmNullptrLiteral(ctx,module,(ExprNullptrLiteral *)expression);
    break;
  case 10:
    ctx_local = (ExpressionContext *)
                CompileVmFunctionIndexLiteral(ctx,module,(ExprFunctionIndexLiteral *)expression);
    break;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x105b,"VmValue *CompileVm(ExpressionContext &, VmModule *, ExprBase *)");
  case 0xe:
    ctx_local = (ExpressionContext *)CompileVmPassthrough(ctx,module,(ExprPassthrough *)expression);
    break;
  case 0xf:
    ctx_local = (ExpressionContext *)CompileVmArray(ctx,module,(ExprArray *)expression);
    break;
  case 0x10:
    ctx_local = (ExpressionContext *)CompileVmPreModify(ctx,module,(ExprPreModify *)expression);
    break;
  case 0x11:
    ctx_local = (ExpressionContext *)CompileVmPostModify(ctx,module,(ExprPostModify *)expression);
    break;
  case 0x12:
    ctx_local = (ExpressionContext *)CompileVmTypeCast(ctx,module,(ExprTypeCast *)expression);
    break;
  case 0x13:
    ctx_local = (ExpressionContext *)CompileVmUnaryOp(ctx,module,(ExprUnaryOp *)expression);
    break;
  case 0x14:
    ctx_local = (ExpressionContext *)CompileVmBinaryOp(ctx,module,(ExprBinaryOp *)expression);
    break;
  case 0x15:
    ctx_local = (ExpressionContext *)CompileVmGetAddress(ctx,module,(ExprGetAddress *)expression);
    break;
  case 0x16:
    ctx_local = (ExpressionContext *)CompileVmDereference(ctx,module,(ExprDereference *)expression);
    break;
  case 0x17:
    ctx_local = (ExpressionContext *)CompileVmUnboxing(ctx,module,(ExprUnboxing *)expression);
    break;
  case 0x18:
    ctx_local = (ExpressionContext *)CompileVmConditional(ctx,module,(ExprConditional *)expression);
    break;
  case 0x19:
    ctx_local = (ExpressionContext *)CompileVmAssignment(ctx,module,(ExprAssignment *)expression);
    break;
  case 0x1a:
    ctx_local = (ExpressionContext *)
                CompileVmMemberAccess(ctx,module,(ExprMemberAccess *)expression);
    break;
  case 0x1b:
    ctx_local = (ExpressionContext *)CompileVmArrayIndex(ctx,module,(ExprArrayIndex *)expression);
    break;
  case 0x1c:
    ctx_local = (ExpressionContext *)CompileVmReturn(ctx,module,(ExprReturn *)expression);
    break;
  case 0x1d:
    ctx_local = (ExpressionContext *)CompileVmYield(ctx,module,(ExprYield *)expression);
    break;
  case 0x1e:
    ctx_local = (ExpressionContext *)
                CompileVmVariableDefinition(ctx,module,(ExprVariableDefinition *)expression);
    break;
  case 0x1f:
    ctx_local = (ExpressionContext *)
                CompileVmZeroInitialize(ctx,module,(ExprZeroInitialize *)expression);
    break;
  case 0x20:
    ctx_local = (ExpressionContext *)CompileVmArraySetup(ctx,module,(ExprArraySetup *)expression);
    break;
  case 0x21:
    ctx_local = (ExpressionContext *)
                CompileVmVariableDefinitions(ctx,module,(ExprVariableDefinitions *)expression);
    break;
  case 0x22:
    ctx_local = (ExpressionContext *)
                CompileVmVariableAccess(ctx,module,(ExprVariableAccess *)expression);
    break;
  case 0x23:
    ctx_local = (ExpressionContext *)
                CompileVmFunctionContextAccess(ctx,module,(ExprFunctionContextAccess *)expression);
    break;
  case 0x24:
    ctx_local = (ExpressionContext *)
                CompileVmFunctionDefinition(ctx,module,(ExprFunctionDefinition *)expression);
    break;
  case 0x25:
    ctx_local = (ExpressionContext *)
                CompileVmGenericFunctionPrototype
                          (ctx,module,(ExprGenericFunctionPrototype *)expression);
    break;
  case 0x26:
    ctx_local = (ExpressionContext *)
                CompileVmFunctionAccess(ctx,module,(ExprFunctionAccess *)expression);
    break;
  case 0x29:
    ctx_local = (ExpressionContext *)
                CompileVmFunctionCall(ctx,module,(ExprFunctionCall *)expression);
    break;
  case 0x2a:
    ctx_local = (ExpressionContext *)
                CompileVmAliasDefinition(ctx,module,(ExprAliasDefinition *)expression);
    break;
  case 0x2b:
    ctx_local = (ExpressionContext *)
                CompileVmClassPrototype(ctx,module,(ExprClassPrototype *)expression);
    break;
  case 0x2c:
    ctx_local = (ExpressionContext *)
                CompileVmGenericClassPrototype(ctx,module,(ExprGenericClassPrototype *)expression);
    break;
  case 0x2d:
    ctx_local = (ExpressionContext *)
                CompileVmClassDefinition(ctx,module,(ExprClassDefinition *)expression);
    break;
  case 0x2e:
    ctx_local = (ExpressionContext *)
                CompileVmEnumDefinition(ctx,module,(ExprEnumDefinition *)expression);
    break;
  case 0x2f:
    ctx_local = (ExpressionContext *)CompileVmIfElse(ctx,module,(ExprIfElse *)expression);
    break;
  case 0x30:
    ctx_local = (ExpressionContext *)CompileVmFor(ctx,module,(ExprFor *)expression);
    break;
  case 0x31:
    ctx_local = (ExpressionContext *)CompileVmWhile(ctx,module,(ExprWhile *)expression);
    break;
  case 0x32:
    ctx_local = (ExpressionContext *)CompileVmDoWhile(ctx,module,(ExprDoWhile *)expression);
    break;
  case 0x33:
    ctx_local = (ExpressionContext *)CompileVmSwitch(ctx,module,(ExprSwitch *)expression);
    break;
  case 0x34:
    ctx_local = (ExpressionContext *)CompileVmBreak(ctx,module,(ExprBreak *)expression);
    break;
  case 0x35:
    ctx_local = (ExpressionContext *)CompileVmContinue(ctx,module,(ExprContinue *)expression);
    break;
  case 0x36:
    ctx_local = (ExpressionContext *)CompileVmBlock(ctx,module,(ExprBlock *)expression);
    break;
  case 0x37:
    ctx_local = (ExpressionContext *)CompileVmSequence(ctx,module,(ExprSequence *)expression);
  }
  return (VmValue *)ctx_local;
}

Assistant:

VmValue* CompileVm(ExpressionContext &ctx, VmModule *module, ExprBase *expression)
{
	switch(expression->typeID)
	{
	case ExprVoid::myTypeID:
		return CompileVmVoid(ctx, module, (ExprVoid*)expression);
	case ExprBoolLiteral::myTypeID:
		return CompileVmBoolLiteral(ctx, module, (ExprBoolLiteral*)expression);
	case ExprCharacterLiteral::myTypeID:
		return CompileVmCharacterLiteral(ctx, module, (ExprCharacterLiteral*)expression);
	case ExprStringLiteral::myTypeID:
		return CompileVmStringLiteral(ctx, module, (ExprStringLiteral*)expression);
	case ExprIntegerLiteral::myTypeID:
		return CompileVmIntegerLiteral(ctx, module, (ExprIntegerLiteral*)expression);
	case ExprRationalLiteral::myTypeID:
		return CompileVmRationalLiteral(ctx, module, (ExprRationalLiteral*)expression);
	case ExprTypeLiteral::myTypeID:
		return CompileVmTypeLiteral(ctx, module, (ExprTypeLiteral*)expression);
	case ExprNullptrLiteral::myTypeID:
		return CompileVmNullptrLiteral(ctx, module, (ExprNullptrLiteral*)expression);
	case ExprFunctionIndexLiteral::myTypeID:
		return CompileVmFunctionIndexLiteral(ctx, module, (ExprFunctionIndexLiteral*)expression);
	case ExprPassthrough::myTypeID:
		return CompileVmPassthrough(ctx, module, (ExprPassthrough*)expression);
	case ExprArray::myTypeID:
		return CompileVmArray(ctx, module, (ExprArray*)expression);
	case ExprPreModify::myTypeID:
		return CompileVmPreModify(ctx, module, (ExprPreModify*)expression);
	case ExprPostModify::myTypeID:
		return CompileVmPostModify(ctx, module, (ExprPostModify*)expression);
	case ExprTypeCast::myTypeID:
		return CompileVmTypeCast(ctx, module, (ExprTypeCast*)expression);
	case ExprUnaryOp::myTypeID:
		return CompileVmUnaryOp(ctx, module, (ExprUnaryOp*)expression);
	case ExprBinaryOp::myTypeID:
		return CompileVmBinaryOp(ctx, module, (ExprBinaryOp*)expression);
	case ExprGetAddress::myTypeID:
		return CompileVmGetAddress(ctx, module, (ExprGetAddress*)expression);
	case ExprDereference::myTypeID:
		return CompileVmDereference(ctx, module, (ExprDereference*)expression);
	case ExprUnboxing::myTypeID:
		return CompileVmUnboxing(ctx, module, (ExprUnboxing*)expression);
	case ExprConditional::myTypeID:
		return CompileVmConditional(ctx, module, (ExprConditional*)expression);
	case ExprAssignment::myTypeID:
		return CompileVmAssignment(ctx, module, (ExprAssignment*)expression);
	case ExprMemberAccess::myTypeID:
		return CompileVmMemberAccess(ctx, module, (ExprMemberAccess*)expression);
	case ExprArrayIndex::myTypeID:
		return CompileVmArrayIndex(ctx, module, (ExprArrayIndex*)expression);
	case ExprReturn::myTypeID:
		return CompileVmReturn(ctx, module, (ExprReturn*)expression);
	case ExprYield::myTypeID:
		return CompileVmYield(ctx, module, (ExprYield*)expression);
	case ExprVariableDefinition::myTypeID:
		return CompileVmVariableDefinition(ctx, module, (ExprVariableDefinition*)expression);
	case ExprZeroInitialize::myTypeID:
		return CompileVmZeroInitialize(ctx, module, (ExprZeroInitialize*)expression);
	case ExprArraySetup::myTypeID:
		return CompileVmArraySetup(ctx, module, (ExprArraySetup*)expression);
	case ExprVariableDefinitions::myTypeID:
		return CompileVmVariableDefinitions(ctx, module, (ExprVariableDefinitions*)expression);
	case ExprVariableAccess::myTypeID:
		return CompileVmVariableAccess(ctx, module, (ExprVariableAccess*)expression);
	case ExprFunctionContextAccess::myTypeID:
		return CompileVmFunctionContextAccess(ctx, module, (ExprFunctionContextAccess*)expression);
	case ExprFunctionDefinition::myTypeID:
		return CompileVmFunctionDefinition(ctx, module, (ExprFunctionDefinition*)expression);
	case ExprGenericFunctionPrototype::myTypeID:
		return CompileVmGenericFunctionPrototype(ctx, module, (ExprGenericFunctionPrototype*)expression);
	case ExprFunctionAccess::myTypeID:
		return CompileVmFunctionAccess(ctx, module, (ExprFunctionAccess*)expression);
	case ExprFunctionCall::myTypeID:
		return CompileVmFunctionCall(ctx, module, (ExprFunctionCall*)expression);
	case ExprAliasDefinition::myTypeID:
		return CompileVmAliasDefinition(ctx, module, (ExprAliasDefinition*)expression);
	case ExprClassPrototype::myTypeID:
		return CompileVmClassPrototype(ctx, module, (ExprClassPrototype*)expression);
	case ExprGenericClassPrototype::myTypeID:
		return CompileVmGenericClassPrototype(ctx, module, (ExprGenericClassPrototype*)expression);
	case ExprClassDefinition::myTypeID:
		return CompileVmClassDefinition(ctx, module, (ExprClassDefinition*)expression);
	case ExprEnumDefinition::myTypeID:
		return CompileVmEnumDefinition(ctx, module, (ExprEnumDefinition*)expression);
	case ExprIfElse::myTypeID:
		return CompileVmIfElse(ctx, module, (ExprIfElse*)expression);
	case ExprFor::myTypeID:
		return CompileVmFor(ctx, module, (ExprFor*)expression);
	case ExprWhile::myTypeID:
		return CompileVmWhile(ctx, module, (ExprWhile*)expression);
	case ExprDoWhile::myTypeID:
		return CompileVmDoWhile(ctx, module, (ExprDoWhile*)expression);
	case ExprSwitch::myTypeID:
		return CompileVmSwitch(ctx, module, (ExprSwitch*)expression);
	case ExprBreak::myTypeID:
		return CompileVmBreak(ctx, module, (ExprBreak*)expression);
	case ExprContinue::myTypeID:
		return CompileVmContinue(ctx, module, (ExprContinue*)expression);
	case ExprBlock::myTypeID:
		return CompileVmBlock(ctx, module, (ExprBlock*)expression);
	case ExprSequence::myTypeID:
		return CompileVmSequence(ctx, module, (ExprSequence*)expression);
	}

	assert(!"unknown type");

	return NULL;
}